

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_type_enums
                 (lysc_ctx *ctx,lysp_type_enum *enums_p,LY_DATA_TYPE basetype,
                 lysc_type_bitenum_item *base_enums,lysc_type_bitenum_item **bitenums)

{
  void **ppvVar1;
  byte *pbVar2;
  long lVar3;
  lysc_type_bitenum_item *plVar4;
  lysc_ext_instance *plVar5;
  lysp_ext_instance *plVar6;
  bool bVar7;
  lysc_type_bitenum_item **pplVar8;
  lysp_type_enum *plVar9;
  anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *paVar10;
  int iVar11;
  uint uVar12;
  LY_ERR LVar13;
  LY_ERR LVar14;
  undefined8 *puVar15;
  long *plVar16;
  lysp_ext_instance *plVar17;
  ulong uVar18;
  char *pcVar19;
  lysp_ext_instance *plVar20;
  char *format;
  long lVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint *puVar27;
  anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *paVar28;
  ly_ctx *plVar29;
  char *pcVar30;
  lysc_type_bitenum_item *plVar31;
  lysp_type_enum *plVar32;
  void *pvVar33;
  ly_bool enabled;
  lysc_type_bitenum_item storage;
  undefined8 in_stack_ffffffffffffff38;
  ly_bool local_b9;
  LY_ERR local_b8;
  LY_DATA_TYPE local_b4;
  lysc_type_bitenum_item **local_b0;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  ulong local_98;
  lysc_type_bitenum_item *local_90;
  lysc_type_bitenum_item *local_88;
  lysp_type_enum *local_80;
  lysp_type_enum *local_78;
  int local_70;
  uint local_6c;
  long local_68;
  ulong local_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  lysc_ext_instance *plStack_40;
  undefined8 local_38;
  
  local_b0 = bitenums;
  if ((base_enums != (lysc_type_bitenum_item *)0x0) && (ctx->pmod->version < 2)) {
    plVar29 = ctx->ctx;
    pcVar30 = "Bits";
    if (basetype == LY_TYPE_ENUM) {
      pcVar30 = "Enumeration";
    }
    pcVar19 = "%s type can be subtyped only in YANG 1.1 modules.";
LAB_001475e6:
    ly_vlog(plVar29,(char *)0x0,LYVE_SYNTAX_YANG,pcVar19,pcVar30);
    return LY_EVALID;
  }
  uVar24 = 0;
  local_98 = 0x80000000;
  local_68 = -8;
  local_70 = (uint)(basetype == LY_TYPE_ENUM) << 9;
  lVar21 = 0;
  local_a4 = 0x80000000;
  local_a0 = 0;
  local_a8 = 0;
  LVar13 = LY_SUCCESS;
  local_b4 = basetype;
  local_90 = base_enums;
  local_78 = enums_p;
  do {
    if (local_78 == (lysp_type_enum *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = *(ulong *)&local_78[-1].flags;
    }
    if (uVar18 <= uVar24) {
      return LVar13;
    }
    if (local_90 != (lysc_type_bitenum_item *)0x0) {
      lVar3._0_4_ = local_90[-1].field_4;
      lVar3._4_2_ = local_90[-1].flags;
      lVar3._6_2_ = *(undefined2 *)&local_90[-1].field_0x26;
      if (lVar3 == 0) {
        lVar21 = 0;
      }
      else {
        pcVar30 = local_78[uVar24].name;
        lVar22 = 0;
        plVar31 = local_90;
        do {
          iVar11 = strcmp(pcVar30,plVar31->name);
          lVar21 = lVar22;
          if (iVar11 == 0) break;
          lVar22 = lVar22 + 1;
          plVar31 = plVar31 + 1;
          lVar21 = lVar3;
        } while (lVar3 != lVar22);
      }
      if (lVar21 == lVar3) {
        pcVar30 = "bits";
        if (local_b4 == LY_TYPE_ENUM) {
          pcVar30 = "enumeration";
        }
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid %s - derived type adds new item \"%s\".",pcVar30,local_78[uVar24].name);
        return LY_EVALID;
      }
    }
    plVar9 = local_78;
    plVar32 = local_78 + uVar24;
    local_60 = uVar24;
    if (local_b4 == LY_TYPE_ENUM) {
      uVar12 = (uint)local_98;
      if ((local_78[uVar24].flags >> 9 & 1) == 0) {
        if (local_90 == (lysc_type_bitenum_item *)0x0) {
          if (uVar24 == 0) {
            uVar23 = 0;
          }
          else {
            if (uVar12 == 0x7fffffff) {
              plVar29 = ctx->ctx;
              pcVar30 = plVar32->name;
              pcVar19 = 
              "Invalid enumeration - it is not possible to auto-assign enum value for \"%s\" since the highest value is already 2147483647."
              ;
              goto LAB_001475e6;
            }
            uVar23 = uVar12 + 1;
          }
        }
        else {
          uVar23 = local_90[lVar21].field_4.value;
        }
      }
      else {
        uVar23 = (uint)plVar32->value;
        plVar31 = *local_b0;
        uVar18 = 0xffffffffffffffff;
        paVar10 = &plVar31->field_4;
        while( true ) {
          paVar28 = paVar10;
          if (plVar31 == (lysc_type_bitenum_item *)0x0) {
            uVar25 = 0;
          }
          else {
            uVar25._0_4_ = plVar31[-1].field_4;
            uVar25._4_2_ = plVar31[-1].flags;
            uVar25._6_2_ = *(undefined2 *)&plVar31[-1].field_0x26;
          }
          uVar18 = uVar18 + 1;
          if (uVar25 <= uVar18) break;
          paVar10 = paVar28 + 10;
          if (paVar28->value == uVar23) {
            plVar29 = ctx->ctx;
            pcVar30 = plVar32->name;
            pcVar19 = ((lysc_type_bitenum_item *)(paVar28 + -8))->name;
            format = "Invalid enumeration - value %d collide in items \"%s\" and \"%s\".";
LAB_00147c3b:
            ly_vlog(plVar29,(char *)0x0,LYVE_SYNTAX_YANG,format,(ulong)uVar23,pcVar30,pcVar19);
            return LY_EVALID;
          }
        }
      }
      if ((int)uVar12 <= (int)uVar23) {
        uVar12 = uVar23;
      }
      local_98 = (ulong)uVar12;
      local_a4 = uVar23;
    }
    else {
      uVar12 = (uint)local_a0;
      if ((local_78[uVar24].flags >> 9 & 1) == 0) {
        if (local_90 == (lysc_type_bitenum_item *)0x0) {
          if (uVar24 == 0) {
            uVar23 = 0;
          }
          else {
            if (uVar12 == 0xffffffff) {
              plVar29 = ctx->ctx;
              pcVar30 = plVar32->name;
              pcVar19 = 
              "Invalid bits - it is not possible to auto-assign bit position for \"%s\" since the highest value is already 4294967295."
              ;
              goto LAB_001475e6;
            }
            uVar23 = uVar12 + 1;
          }
        }
        else {
          uVar23 = local_90[lVar21].field_4.position;
        }
      }
      else {
        uVar23 = (uint)plVar32->value;
        plVar31 = *local_b0;
        uVar18 = 0xffffffffffffffff;
        paVar10 = &plVar31->field_4;
        while( true ) {
          paVar28 = paVar10;
          if (plVar31 == (lysc_type_bitenum_item *)0x0) {
            uVar26 = 0;
          }
          else {
            uVar26._0_4_ = plVar31[-1].field_4;
            uVar26._4_2_ = plVar31[-1].flags;
            uVar26._6_2_ = *(undefined2 *)&plVar31[-1].field_0x26;
          }
          uVar18 = uVar18 + 1;
          if (uVar26 <= uVar18) break;
          paVar10 = paVar28 + 10;
          if (paVar28->value == uVar23) {
            plVar29 = ctx->ctx;
            pcVar30 = plVar32->name;
            pcVar19 = ((lysc_type_bitenum_item *)(paVar28 + -8))->name;
            format = "Invalid bits - position %u collide in items \"%s\" and \"%s\".";
            goto LAB_00147c3b;
          }
        }
      }
      if (uVar12 <= uVar23) {
        uVar12 = uVar23;
      }
      local_a0 = (ulong)uVar12;
      local_a8 = uVar23;
    }
    if (local_90 != (lysc_type_bitenum_item *)0x0) {
      uVar12 = local_90[lVar21].field_4.position;
      if (local_b4 == LY_TYPE_ENUM) {
        if (local_a4 != uVar12) {
          plVar29 = ctx->ctx;
          pcVar30 = local_78[uVar24].name;
          pcVar19 = 
          "Invalid enumeration - value of the item \"%s\" has changed from %d to %d in the derived type."
          ;
          uVar23 = local_a4;
LAB_00147ceb:
          ly_vlog(plVar29,(char *)0x0,LYVE_SYNTAX_YANG,pcVar19,pcVar30,(ulong)uVar12,
                  CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),uVar23));
          return LY_EVALID;
        }
      }
      else if (local_a8 != uVar12) {
        plVar29 = ctx->ctx;
        pcVar30 = local_78[uVar24].name;
        pcVar19 = 
        "Invalid bits - position of the item \"%s\" has changed from %u to %u in the derived type.";
        uVar23 = local_a8;
        goto LAB_00147ceb;
      }
    }
    plVar31 = *local_b0;
    local_88 = (lysc_type_bitenum_item *)(uVar24 * 0x38);
    if (plVar31 == (lysc_type_bitenum_item *)0x0) {
      puVar15 = (undefined8 *)malloc(0x30);
      if (puVar15 != (undefined8 *)0x0) {
        *puVar15 = 1;
        goto LAB_00147844;
      }
LAB_00147855:
      bVar7 = false;
      local_b8 = LY_EMEM;
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_enums");
    }
    else {
      lVar3 = *(long *)&plVar31[-1].field_4;
      *(long *)&plVar31[-1].field_4 = lVar3 + 1;
      puVar15 = (undefined8 *)realloc(&plVar31[-1].field_4,lVar3 * 0x28 + 0x30);
      if (puVar15 == (undefined8 *)0x0) {
        *(long *)&(*local_b0)[-1].field_4 = *(long *)&(*local_b0)[-1].field_4 + -1;
        goto LAB_00147855;
      }
LAB_00147844:
      *local_b0 = (lysc_type_bitenum_item *)(puVar15 + 1);
      bVar7 = true;
    }
    if (!bVar7) {
      return local_b8;
    }
    plVar4 = *local_b0;
    lVar3 = *(long *)&plVar4[-1].field_4;
    plVar31 = plVar4 + lVar3 + -1;
    plVar31->ref = (char *)0x0;
    plVar31->exts = (lysc_ext_instance *)0x0;
    plVar31->name = (char *)0x0;
    plVar31->dsc = (char *)0x0;
    plVar31->field_4 = (anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4)0x0;
    plVar31->flags = 0;
    *(undefined2 *)&plVar31->field_0x26 = 0;
    puVar15 = (undefined8 *)((long)&plVar9->name + (long)local_88);
    local_88 = plVar31;
    local_80 = plVar32;
    local_6c = uVar23;
    LVar13 = lydict_dup(ctx->ctx,(char *)*puVar15,&plVar31->name);
    plVar32 = local_80;
    if (LVar13 != LY_SUCCESS) {
      return LVar13;
    }
    LVar13 = lydict_dup(ctx->ctx,local_80->dsc,&plVar4[lVar3 + -1].dsc);
    if (LVar13 != LY_SUCCESS) {
      return LVar13;
    }
    LVar13 = lydict_dup(ctx->ctx,plVar32->ref,&plVar4[lVar3 + -1].ref);
    if (LVar13 != LY_SUCCESS) {
      return LVar13;
    }
    plVar4[lVar3 + -1].flags = (ushort)(byte)plVar32->flags | (ushort)local_70;
    plVar4[lVar3 + -1].field_4.value = local_6c;
    plVar20 = plVar32->exts;
    if (plVar20 == (lysp_ext_instance *)0x0) {
      LVar13 = LY_SUCCESS;
    }
    else {
      plVar5 = plVar4[lVar3 + -1].exts;
      if (plVar5 == (lysc_ext_instance *)0x0) {
        pvVar33 = (void *)0x0;
        plVar16 = (long *)calloc(1,(long)plVar20[-1].exts * 0x48 + 8);
      }
      else {
        pvVar33 = plVar5[-1].compiled;
        plVar16 = (long *)realloc(&plVar5[-1].compiled,
                                  ((long)&(plVar20[-1].exts)->name +
                                  (long)plVar5[-1].compiled + (long)pvVar33) * 0x48 + 8);
      }
      if (plVar16 == (long *)0x0) {
        bVar7 = false;
        LVar13 = LY_EMEM;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_enums"
              );
        iVar11 = 0xe;
      }
      else {
        plVar4[lVar3 + -1].exts = (lysc_ext_instance *)(plVar16 + 1);
        if (plVar32->exts == (lysp_ext_instance *)0x0) {
          plVar20 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar20 = plVar32->exts[-1].exts;
        }
        LVar13 = LY_SUCCESS;
        memset(plVar16 + *plVar16 * 9 + 1,0,((long)&plVar20->name + (long)pvVar33) * 0x48);
        bVar7 = true;
        iVar11 = 0;
      }
      if (bVar7) {
        lVar22 = 0;
        plVar20 = (lysp_ext_instance *)0x0;
        while( true ) {
          plVar6 = local_80->exts;
          if (plVar6 == (lysp_ext_instance *)0x0) {
            plVar17 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar17 = plVar6[-1].exts;
          }
          if (plVar17 <= plVar20) break;
          plVar5 = plVar4[lVar3 + -1].exts;
          pvVar33 = plVar5[-1].compiled;
          plVar5[-1].compiled = (void *)((long)pvVar33 + 1);
          LVar13 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar6->name + lVar22),
                                   plVar5 + (-(ulong)(plVar5 == (lysc_ext_instance *)0x0) |
                                            (ulong)pvVar33),local_88);
          if (LVar13 != LY_SUCCESS) {
            if (LVar13 != LY_ENOT) {
              iVar11 = 0xe;
              plVar32 = local_80;
              goto LAB_00147ae0;
            }
            ppvVar1 = &plVar4[lVar3 + -1].exts[-1].compiled;
            *ppvVar1 = (void *)((long)*ppvVar1 + -1);
          }
          plVar20 = (lysp_ext_instance *)((long)&plVar20->name + 1);
          lVar22 = lVar22 + 0x70;
          LVar13 = LY_SUCCESS;
        }
        iVar11 = 0;
        plVar32 = local_80;
      }
LAB_00147ae0:
      if (iVar11 != 0) {
        if (iVar11 == 0xe) {
          return LVar13;
        }
        return local_b8;
      }
    }
    uVar24 = local_60;
    LVar14 = lys_eval_iffeatures(ctx->ctx,plVar32->iffeatures,&local_b9);
    pplVar8 = local_b0;
    if (LVar14 != LY_SUCCESS) {
      return LVar14;
    }
    if (local_b9 == '\0') {
      pbVar2 = (byte *)((long)&plVar4[lVar3 + -1].flags + 1);
      *pbVar2 = *pbVar2 | 1;
    }
    if (local_b4 == LY_TYPE_BITS) {
      uVar18 = uVar24;
      if (uVar24 != 0) {
        puVar27 = (uint *)((long)&(*local_b0)->name + local_68);
        do {
          if (*puVar27 <= plVar4[lVar3 + -1].field_4.position) goto LAB_00147b60;
          puVar27 = puVar27 + -10;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
        uVar18 = 0;
      }
LAB_00147b60:
      if (uVar24 - uVar18 != 0) {
        local_38._0_4_ = local_88->field_4;
        local_38._4_2_ = local_88->flags;
        local_38._6_2_ = *(undefined2 *)&local_88->field_0x26;
        local_58 = local_88->name;
        pcStack_50 = local_88->dsc;
        local_48 = local_88->ref;
        plStack_40 = local_88->exts;
        memmove(*local_b0 + uVar18 + 1,*local_b0 + uVar18,(uVar24 - uVar18) * 0x28);
        plVar31 = *pplVar8;
        plVar31[uVar18].name = local_58;
        plVar31[uVar18].dsc = pcStack_50;
        plVar31[uVar18].ref = local_48;
        (&plVar31[uVar18].ref)[1] = (char *)plStack_40;
        plVar31 = plVar31 + uVar18;
        plVar31->field_4 =
             (anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4)(undefined4)local_38;
        plVar31->flags = local_38._4_2_;
        *(undefined2 *)&plVar31->field_0x26 = local_38._6_2_;
      }
    }
    uVar24 = uVar24 + 1;
    local_68 = local_68 + 0x28;
  } while( true );
}

Assistant:

LY_ERR
lys_compile_type_enums(struct lysc_ctx *ctx, const struct lysp_type_enum *enums_p, LY_DATA_TYPE basetype,
        struct lysc_type_bitenum_item *base_enums, struct lysc_type_bitenum_item **bitenums)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v, match = 0;
    int32_t highest_value = INT32_MIN, cur_val = INT32_MIN;
    uint32_t highest_position = 0, cur_pos = 0;
    struct lysc_type_bitenum_item *e, storage;
    ly_bool enabled;

    if (base_enums && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "%s type can be subtyped only in YANG 1.1 modules.",
                basetype == LY_TYPE_ENUM ? "Enumeration" : "Bits");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(enums_p, u) {
        /* perform all checks */
        if (base_enums) {
            /* check the enum/bit presence in the base type - the set of enums/bits in the derived type must be a subset */
            LY_ARRAY_FOR(base_enums, v) {
                if (!strcmp(enums_p[u].name, base_enums[v].name)) {
                    break;
                }
            }
            if (v == LY_ARRAY_COUNT(base_enums)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s - derived type adds new item \"%s\".",
                        basetype == LY_TYPE_ENUM ? "enumeration" : "bits", enums_p[u].name);
                return LY_EVALID;
            }
            match = v;
        }

        if (basetype == LY_TYPE_ENUM) {
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_val = (int32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_val == (*bitenums)[v].value) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid enumeration - value %" PRId32 " collide in items \"%s\" and \"%s\".",
                                cur_val, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_val = base_enums[match].value;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_val = 0;
                } else if (highest_value == INT32_MAX) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - it is not possible to auto-assign enum value for "
                            "\"%s\" since the highest value is already 2147483647.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_val = highest_value + 1;
                }
            }

            /* save highest value for auto assing */
            if (highest_value < cur_val) {
                highest_value = cur_val;
            }
        } else { /* LY_TYPE_BITS */
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_pos = (uint32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_pos == (*bitenums)[v].position) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid bits - position %" PRIu32 " collide in items \"%s\" and \"%s\".",
                                cur_pos, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_pos = base_enums[match].position;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_pos = 0;
                } else if (highest_position == UINT32_MAX) {
                    /* counter overflow */
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - it is not possible to auto-assign bit position for "
                            "\"%s\" since the highest value is already 4294967295.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_pos = highest_position + 1;
                }
            }

            /* save highest position for auto assing */
            if (highest_position < cur_pos) {
                highest_position = cur_pos;
            }
        }

        /* the assigned values must not change from the derived type */
        if (base_enums) {
            if (basetype == LY_TYPE_ENUM) {
                if (cur_val != base_enums[match].value) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - value of the item \"%s\" has changed from %" PRId32 " to %" PRId32
                            " in the derived type.", enums_p[u].name, base_enums[match].value, cur_val);
                    return LY_EVALID;
                }
            } else {
                if (cur_pos != base_enums[match].position) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - position of the item \"%s\" has changed from %" PRIu32 " to %" PRIu32
                            " in the derived type.", enums_p[u].name, base_enums[match].position, cur_pos);
                    return LY_EVALID;
                }
            }
        }

        /* add new enum/bit */
        LY_ARRAY_NEW_RET(ctx->ctx, *bitenums, e, LY_EMEM);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].name, e->name, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].dsc, e->dsc, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].ref, e->ref, ret, done);
        e->flags = (enums_p[u].flags & LYS_FLAGS_COMPILED_MASK) | (basetype == LY_TYPE_ENUM ? LYS_IS_ENUM : 0);
        if (basetype == LY_TYPE_ENUM) {
            e->value = cur_val;
        } else {
            e->position = cur_pos;
        }
        COMPILE_EXTS_GOTO(ctx, enums_p[u].exts, e->exts, e, ret, done);

        /* evaluate if-ffeatures */
        LY_CHECK_RET(lys_eval_iffeatures(ctx->ctx, enums_p[u].iffeatures, &enabled));
        if (!enabled) {
            /* set only flag, later resolved and removed */
            e->flags |= LYS_DISABLED;
        }

        if (basetype == LY_TYPE_BITS) {
            /* keep bits ordered by position */
            for (v = u; v && (*bitenums)[v - 1].position > e->position; --v) {}
            if (v != u) {
                memcpy(&storage, e, sizeof *e);
                memmove(&(*bitenums)[v + 1], &(*bitenums)[v], (u - v) * sizeof **bitenums);
                memcpy(&(*bitenums)[v], &storage, sizeof storage);
            }
        }
    }

done:
    return ret;
}